

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxyd.c
# Opt level: O0

char * proxy_config_hint(void)

{
  int iVar1;
  char *local_10;
  
  iVar1 = access("ELProxy.conf",4);
  if (iVar1 == 0) {
    local_10 = "ELProxy.conf";
  }
  else {
    local_10 = "../etc/ELProxy.conf";
  }
  return local_10;
}

Assistant:

static const char *proxy_config_hint(void)
{
	if (access(config_path_default, R_OK) != 0) {
#  ifdef _WIN32
		/* Check if path hint is relative */
		if (config_path_hint[0] != '\\' &&
		    config_path_hint[0] != '/' &&
		    config_path_hint[1] != ':' &&
		    config_path_hint[2] != ':') {
			static char exe_path[MAX_PATH];
			int exe_path_ret;

			exe_path_ret = GetModuleFileName(NULL, exe_path,
							 MAX_PATH);
			if (exe_path > 0 && exe_path_ret +
			    strlen(config_path_hint) + 1 < MAX_PATH) {
				char *tmp;

				while (exe_path_ret > 0 &&
				       exe_path[exe_path_ret - 1] != '\\')
					exe_path_ret--;
				tmp = &exe_path[exe_path_ret];
				strcpy(tmp, config_path_hint);

				for (; *tmp != '\0'; tmp++)
					if (*tmp == '/')
						*tmp = '\\';

				return exe_path;
			} else {
				return config_path_default;
			}
		} else
#  endif
		{
			return config_path_hint;
		}
	} else {
		return config_path_default;
	}
}